

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.h
# Opt level: O0

void pybind11::detail::initimpl::construct<pybind11::class_<SupportType>>
               (value_and_holder *v_h,Cpp<pybind11::class_<SupportType>_> *result,bool need_alias)

{
  undefined1 *puVar1;
  void **ppvVar2;
  undefined1 *in_RSI;
  value_and_holder *in_RDI;
  
  puVar1 = (undefined1 *)operator_new(1);
  *puVar1 = *in_RSI;
  ppvVar2 = value_and_holder::value_ptr<void>(in_RDI);
  *ppvVar2 = puVar1;
  return;
}

Assistant:

void construct(value_and_holder &v_h, Cpp<Class> &&result, bool need_alias) {
    static_assert(std::is_move_constructible<Cpp<Class>>::value,
        "pybind11::init() return-by-value factory function requires a movable class");
    if (Class::has_alias && need_alias)
        construct_alias_from_cpp<Class>(is_alias_constructible<Class>{}, v_h, std::move(result));
    else
        v_h.value_ptr() = new Cpp<Class>(std::move(result));
}